

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

parse_error * nlohmann::detail::parse_error::create(int id_,position_t *pos,string *what_arg)

{
  undefined8 *in_RDX;
  undefined4 in_ESI;
  parse_error *in_RDI;
  string w;
  char *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  int id__00;
  parse_error *this;
  string local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [24];
  position_t *in_stack_ffffffffffffff58;
  string local_a0 [4];
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string local_80 [32];
  string local_60 [32];
  string local_40 [40];
  undefined8 *local_18;
  undefined4 local_c;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
             (allocator<char> *)in_stack_fffffffffffffef0);
  exception::name(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  std::operator+(in_stack_fffffffffffffec8,
                 (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  position_string_abi_cxx11_(in_stack_ffffffffffffff58);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_stack_fffffffffffffec8,
                 (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::operator+(in_stack_fffffffffffffec8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  id__00 = (int)((ulong)*local_18 >> 0x20);
  std::__cxx11::string::c_str();
  parse_error(this,id__00,CONCAT44(local_c,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + what_arg;
        return parse_error(id_, pos.chars_read_total, w.c_str());
    }